

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::EventImport::~EventImport(EventImport *this)

{
  EventImport *this_local;
  
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__EventImport_0049c8a8;
  Event::~Event(&this->event);
  ImportMixin<(wabt::ExternalKind)4>::~ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)4>);
  return;
}

Assistant:

explicit EventImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Event>(), event(name) {}